

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

uint __thiscall
kj::_::BTreeImpl::split(BTreeImpl *this,Parent *dst,uint dstPos,Parent *src,uint srcPos)

{
  uint uVar1;
  uint pivot;
  size_t mid;
  uint srcPos_local;
  Parent *src_local;
  uint dstPos_local;
  Parent *dst_local;
  BTreeImpl *this_local;
  
  uVar1 = MaybeUint::operator*(src->keys + 3);
  acopy<kj::_::BTreeImpl::MaybeUint>(dst->keys,src->keys + 4,3);
  azero<kj::_::BTreeImpl::MaybeUint>(src->keys + 3,4);
  acopy<unsigned_int>(dst->children,src->children + 4,4);
  azero<unsigned_int>(src->children + 4,4);
  return uVar1;
}

Assistant:

uint BTreeImpl::split(Parent& dst, uint dstPos, Parent& src, uint srcPos) {
  constexpr size_t mid = Parent::NKEYS / 2;
  uint pivot = *src.keys[mid];
  acopy(dst.keys, src.keys + mid + 1, Parent::NKEYS - mid - 1);
  azero(src.keys + mid, Parent::NKEYS - mid);
  acopy(dst.children, src.children + mid + 1, Parent::NCHILDREN - mid - 1);
  azero(src.children + mid + 1, Parent::NCHILDREN - mid - 1);
  return pivot;
}